

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O2

map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>_>_>
* kratos::get_port_from_mod_def
            (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>_>_>
             *__return_storage_ptr__,Generator *generator,string *mod_def)

{
  _Rb_tree_header *p_Var1;
  string *delimiter;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *__lhs;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *__lhs_00;
  undefined4 uVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  string *psVar6;
  undefined1 auVar7 [8];
  runtime_error *prVar8;
  long lVar9;
  undefined1 auVar10 [8];
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  __args_5;
  int iVar11;
  ulong uVar12;
  basic_string_view<char> bVar13;
  string_view format_str;
  string_view format_str_00;
  string_view format_str_01;
  string_view format_str_02;
  string_view format_str_03;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  format_args args_03;
  undefined1 local_1e0 [8];
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ignore_list;
  regex re;
  string input_type;
  Generator *generator_local;
  undefined1 auStack_158 [8];
  string port_declaration;
  shared_ptr<kratos::Port> p;
  string local_118 [32];
  string local_f8 [32];
  undefined1 auStack_d8 [8];
  smatch match;
  value_type token;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tokens;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  size_tokens;
  uint32_t width;
  bool local_44 [4];
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Port>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Port>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Port>>>>
  *local_40;
  undefined4 local_38;
  undefined1 local_31;
  PortDirection direction;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  input_type.field_2._8_8_ = generator;
  local_40 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Port>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Port>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Port>>>>
              *)__return_storage_ptr__;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(port_declaration.field_2._M_local_buf + 8),"logic",
             (allocator<char> *)&ignore_list._M_h._M_single_bucket);
  std::__cxx11::string::string<std::allocator<char>>(local_118,"reg",(allocator<char> *)auStack_d8);
  std::__cxx11::string::string<std::allocator<char>>(local_f8,"wire",(allocator<char> *)auStack_158)
  ;
  __args_5.values_ =
       (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *)
       &match._M_begin;
  std::
  _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  ::_Hashtable<std::__cxx11::string_const*>
            ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              *)local_1e0,(undefined1 *)((long)&port_declaration.field_2 + 8),auStack_d8,0,
             &re._M_automaton.
              super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,__args_5.values_,
             &size_tokens.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  lVar9 = 0x40;
  do {
    std::__cxx11::string::~string((string *)((long)&port_declaration.field_2 + lVar9 + 8));
    lVar9 = lVar9 + -0x20;
  } while (lVar9 != -0x20);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
             &ignore_list._M_h._M_single_bucket,"(input|output)(\\s|\\[)\\s?([\\w,\\s_$\\[\\]:])+",
             0x10);
  match.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  match.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auStack_d8 = (undefined1  [8])0x0;
  match.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  delimiter = (string *)(&port_declaration.field_2._M_allocated_capacity + 1);
  __lhs = &match._M_begin;
  psVar6 = mod_def;
  do {
    bVar3 = std::__detail::
            __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,false>
                      ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )(psVar6->_M_dataplus)._M_p,
                       (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )((mod_def->_M_dataplus)._M_p + mod_def->_M_string_length),
                       (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        *)auStack_d8,
                       (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                       &ignore_list._M_h._M_single_bucket,0);
    if (!bVar3) {
      std::
      _Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::~_Vector_base((_Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       *)auStack_d8);
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                 &ignore_list._M_h._M_single_bucket);
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                     *)local_1e0);
      return (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>_>_>
              *)local_40;
    }
    auVar10 = auStack_d8;
    if ((auStack_d8 !=
         (undefined1  [8])
         match.
         super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
         .
         super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start) &&
       (auVar10 = (undefined1  [8])
                  match.
                  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  .
                  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start,
       ((long)match.
              super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              .
              super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start - (long)auStack_d8) / 0x18 - 5U <
       0xfffffffffffffffe)) {
      auStack_158 = (undefined1  [8])&port_declaration._M_string_length;
      std::__cxx11::string::
      _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                ((string *)auStack_158,
                 (((pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)auStack_d8)->first)._M_current,
                 (((pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)auStack_d8)->second)._M_current);
      __lhs_00 = &re._M_automaton.
                  super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)delimiter,", ",(allocator<char> *)__lhs_00);
      string::get_tokens((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)((long)&token.field_2 + 8),(string *)auStack_158,delimiter);
      std::__cxx11::string::~string((string *)delimiter);
      if ((ulong)((long)tokens.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start - token.field_2._8_8_) < 0x21) {
        prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
        re._M_automaton.
        super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_158;
        input_type._M_dataplus = port_declaration._M_dataplus;
        bVar13 = fmt::v7::to_string_view<char,_0>("unable to parse {}");
        format_str_02.data_ = (char *)bVar13.size_;
        format_str_02.size_ = 0xd;
        args_02.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .field_1.args_ = __args_5.args_;
        args_02.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .desc_ = (unsigned_long_long)
                 &re._M_automaton.
                  super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount;
        fmt::v7::detail::vformat_abi_cxx11_
                  ((string *)((long)&port_declaration.field_2 + 8),(detail *)bVar13.data_,
                   format_str_02,args_02);
        std::runtime_error::runtime_error
                  (prVar8,(string *)(port_declaration.field_2._M_local_buf + 8));
        __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      std::__cxx11::string::string((string *)__lhs_00,(string *)token.field_2._8_8_);
      bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              __lhs_00,"input");
      uVar4 = 0;
      uVar2 = 0;
      if (!bVar3) {
        bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )__lhs_00,"output");
        uVar2 = 1;
        if (!bVar3) {
          prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
          match._M_begin._M_current =
               (char *)re._M_automaton.
                       super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi;
          token._M_dataplus = input_type._M_dataplus;
          bVar13 = fmt::v7::to_string_view<char,_0>("{} has to be either input or output");
          format_str_03.data_ = (char *)bVar13.size_;
          format_str_03.size_ = 0xd;
          args_03.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .field_1.args_ = __args_5.args_;
          args_03.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .desc_ = (unsigned_long_long)&match._M_begin;
          fmt::v7::detail::vformat_abi_cxx11_
                    ((string *)((long)&port_declaration.field_2 + 8),(detail *)bVar13.data_,
                     format_str_03,args_03);
          std::runtime_error::runtime_error
                    (prVar8,(string *)(port_declaration.field_2._M_local_buf + 8));
          __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
      }
      local_38 = uVar2;
      uVar5 = 0;
      uVar12 = 1;
      while (iVar11 = (int)uVar12,
            uVar12 < (ulong)((long)tokens.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start - token.field_2._8_8_
                            >> 5)) {
        std::__cxx11::string::string
                  ((string *)__lhs,(string *)(token.field_2._8_8_ + uVar12 * 0x20));
        if (token._M_dataplus._M_p != (pointer)0x0) {
          if (*match._M_begin._M_current == '[') {
            if ((match._M_begin._M_current + -1)[(long)token._M_dataplus._M_p] != ']') {
              iVar11 = iVar11 + 1;
              std::__cxx11::string::append((string *)__lhs);
              if (*match._M_begin._M_current != '[') goto LAB_001cd55a;
            }
            if ((match._M_begin._M_current + -1)[(long)token._M_dataplus._M_p] != ']') {
              prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
              size_tokens.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)auStack_158;
              bVar13 = fmt::v7::to_string_view<char,_0>("unable to parse {}");
              format_str.data_ = (char *)bVar13.size_;
              format_str.size_ = 0xd;
              args.
              super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
              .field_1.args_ = __args_5.args_;
              args.
              super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
              .desc_ = (unsigned_long_long)
                       &size_tokens.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage;
              fmt::v7::detail::vformat_abi_cxx11_
                        ((string *)((long)&port_declaration.field_2 + 8),(detail *)bVar13.data_,
                         format_str,args);
              std::runtime_error::runtime_error
                        (prVar8,(string *)(port_declaration.field_2._M_local_buf + 8));
              __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)delimiter,"[:] ",
                       (allocator<char> *)
                       &size_tokens.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
            string::get_tokens((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&tokens.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
                               (string *)__lhs,delimiter);
            std::__cxx11::string::~string((string *)delimiter);
            if ((long)size_tokens.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start -
                (long)CONCAT44(tokens.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                               tokens.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_) != 0x40) {
              prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
              size_tokens.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage =
                   (pointer)match._M_begin._M_current;
              bVar13 = fmt::v7::to_string_view<char,_0>("unable to parse {}");
              format_str_00.data_ = (char *)bVar13.size_;
              format_str_00.size_ = 0xd;
              args_00.
              super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
              .field_1.args_ = __args_5.args_;
              args_00.
              super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
              .desc_ = (unsigned_long_long)
                       &size_tokens.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage;
              fmt::v7::detail::vformat_abi_cxx11_
                        ((string *)((long)&port_declaration.field_2 + 8),(detail *)bVar13.data_,
                         format_str_00,args_00);
              std::runtime_error::runtime_error
                        (prVar8,(string *)(port_declaration.field_2._M_local_buf + 8));
              __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
            uVar4 = std::__cxx11::stoi((string *)
                                       CONCAT44(tokens.
                                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_end_of_storage.
                                                _4_4_,tokens.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ._0_4_),(size_t *)0x0,10);
            uVar5 = std::__cxx11::stoi((string *)
                                       (CONCAT44(tokens.
                                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_end_of_storage.
                                                 _4_4_,tokens.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ._0_4_) + 0x20),(size_t *)0x0,10);
            if (uVar4 < uVar5) {
              prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
              port_declaration.field_2._8_8_ = ZEXT48(uVar4);
              p.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(ulong)uVar5;
              bVar13 = fmt::v7::to_string_view<char,_0>("only [hi:lo] is supported, got [{}:{}]");
              format_str_01.data_ = (char *)bVar13.size_;
              format_str_01.size_ = 0x22;
              args_01.
              super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
              .field_1.args_ = __args_5.args_;
              args_01.
              super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
              .desc_ = (unsigned_long_long)((long)&port_declaration.field_2 + 8);
              fmt::v7::detail::vformat_abi_cxx11_
                        ((string *)
                         &size_tokens.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,(detail *)bVar13.data_,
                         format_str_01,args_01);
              std::runtime_error::runtime_error
                        (prVar8,(string *)
                                &size_tokens.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
              __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&tokens.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
          }
          else {
LAB_001cd55a:
            bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)__lhs,"input");
            if (bVar3) {
              local_38 = 0;
            }
            else {
              bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)__lhs,"output");
              if (bVar3) {
                local_38 = 1;
              }
              else {
                bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)__lhs,"inout");
                if (bVar3) {
                  local_38 = 2;
                }
                else {
                  size_tokens.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage =
                       (pointer)CONCAT44(size_tokens.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                                         (uVar4 - uVar5) + 1);
                  tokens.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
                  local_44[0] = false;
                  local_44[1] = false;
                  local_44[2] = false;
                  local_44[3] = false;
                  local_31 = 0;
                  __args_5.values_ =
                       (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                        *)&tokens.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage;
                  std::
                  make_shared<kratos::Port,kratos::Generator*&,kratos::PortDirection&,std::__cxx11::string_const&,unsigned_int&,int,kratos::PortType,bool>
                            ((Generator **)delimiter,
                             (PortDirection *)(input_type.field_2._M_local_buf + 8),
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_38,(uint *)__lhs,
                             (int *)&size_tokens.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
                             (PortType *)__args_5.values_,local_44);
                  std::
                  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Port>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Port>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Port>>>>
                  ::_M_emplace_unique<std::__cxx11::string_const&,std::shared_ptr<kratos::Port>&>
                            (local_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)__lhs,(shared_ptr<kratos::Port> *)delimiter);
                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&p);
                }
              }
            }
          }
        }
        std::__cxx11::string::~string((string *)__lhs);
        uVar12 = (ulong)(iVar11 + 1);
      }
      std::__cxx11::string::~string
                ((string *)
                 &re._M_automaton.
                  super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&token.field_2 + 8));
      std::__cxx11::string::~string((string *)auStack_158);
      auVar10 = (undefined1  [8])
                match.
                super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                .
                super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    }
    auVar7 = auStack_d8;
    if ((long)auVar10 - (long)auStack_d8 == 0x48) {
      auVar7 = (undefined1  [8])((long)auVar10 + -0x48);
    }
    if (auVar10 == auStack_d8) {
      auVar7 = (undefined1  [8])((long)auVar10 + -0x48);
    }
    psVar6 = (string *)
             &(((pointer)auVar7)->
              super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ).second;
  } while( true );
}

Assistant:

std::map<std::string, std::shared_ptr<Port>> get_port_from_mod_def(Generator *generator,
                                                                   const std::string &mod_def) {
    std::map<std::string, std::shared_ptr<Port>> result;
    std::unordered_set<std::string> ignore_list = {"logic", "reg", "wire"};
    std::regex re("(input|output)(\\s|\\[)\\s?([\\w,\\s_$\\[\\]:])+", std::regex::ECMAScript);  // NOLINT
    std::smatch match;
    std::string::const_iterator iter = mod_def.cbegin();
    while (std::regex_search(iter, mod_def.end(), match, re)) {
        if (match.size() > 1) {
            std::string port_declaration = std::string(match[0].first, match[0].second);
            std::vector<std::string> const tokens = string::get_tokens(port_declaration, ", ");
            // the first one has to be either input or output
            if (tokens.size() < 2)
                throw std::runtime_error(::format("unable to parse {}", port_declaration));
            std::string input_type = tokens[0];
            PortDirection direction;
            if (input_type == "input")
                direction = PortDirection::In;
            else if (input_type == "output")
                direction = PortDirection::Out;
            else
                throw std::runtime_error(
                    ::format("{} has to be either input or output", input_type));
            // determine the reset
            uint32_t i = 1;
            uint32_t high = 0;
            uint32_t low = 0;
            while (i < tokens.size()) {
                auto token = tokens[i];
                if (token.empty()) {
                    i++;
                    continue;
                }
                if (token[0] == '[' && token[token.size() - 1] != ']') {
                    token.append(tokens[++i]);
                }
                if (token[0] == '[' && token[token.size() - 1] == ']') {
                    // determine the size
                    std::vector<std::string> size_tokens = string::get_tokens(token, "[:] ");
                    if (size_tokens.size() != 2)
                        throw std::runtime_error(::format("unable to parse {}", token));
                    high = std::stoi(size_tokens[0]);
                    low = std::stoi(size_tokens[1]);
                    if (high < low)
                        throw std::runtime_error(
                            ::format("only [hi:lo] is supported, got [{}:{}]", high, low));
                } else {
                    if (token[0] == '[')
                        throw std::runtime_error(::format("unable to parse {}", port_declaration));
                    if (token == "input") {
                        direction = PortDirection::In;
                        i++;
                        continue;
                    } else if (token == "output") {
                        direction = PortDirection::Out;
                        i++;
                        continue;
                    } else if (token == "inout") {
                        direction = PortDirection ::InOut;
                        i++;
                        continue;
                    }
                    const auto &port_name = token;
                    uint32_t width = high - low + 1;
                    auto p = std::make_shared<Port>(generator, direction, port_name, width, 1,
                                                    PortType::Data, false);
                    result.emplace(port_name, p);
                }

                i++;
            }
        }
        iter = match[0].second;
    }
    return result;
}